

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cpp
# Opt level: O1

int tracy::dwarf_lookup_pc
              (backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
              backtrace_full_callback callback,backtrace_error_callback error_callback,void *data,
              int *found)

{
  ulong *puVar1;
  char *pcVar2;
  unit *u;
  ulong uVar3;
  ulong uVar4;
  function *function;
  dwarf_data *count;
  bool bVar5;
  uint64_t *puVar6;
  long lVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  size_t sVar12;
  syminfo error_callback_00;
  dwarf_data *pdVar13;
  uint16_t uVar14;
  uint32_t uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  unit_addrs *puVar19;
  unit_addrs *puVar20;
  unit_addrs *puVar21;
  fileline p_Var22;
  size_t sVar23;
  undefined8 *puVar24;
  int64_t iVar25;
  uint64_t uVar26;
  backtrace_state *pbVar27;
  backtrace_state *pbVar28;
  void *pvVar29;
  void *pvVar30;
  size_t sVar31;
  unit_addrs **ppuVar32;
  undefined4 *puVar33;
  int iVar34;
  unit **ppuVar35;
  long lVar36;
  code *data_00;
  char *pcVar37;
  backtrace_error_callback error_callback_01;
  line **extraout_RDX;
  line **extraout_RDX_00;
  line **extraout_RDX_01;
  uintptr_t uVar38;
  line **extraout_RDX_02;
  line **extraout_RDX_03;
  line **pplVar39;
  uint64_t pc_00;
  line *__base;
  uint uVar40;
  uint uVar41;
  syminfo p_Var42;
  dwarf_data *vec_function;
  char cVar43;
  line_header *hdr;
  dwarf_data *hdr_00;
  long lVar44;
  backtrace_state *pbVar45;
  uchar *puVar46;
  unit *puVar47;
  unit_addrs *puVar48;
  backtrace_state *pbVar49;
  long lVar50;
  char *p;
  function_addrs *pfVar51;
  function_addrs *pfVar52;
  char *p_1;
  char *pcVar53;
  function_addrs *pfVar54;
  dwarf_data *local_268;
  uintptr_t pc_local;
  uint64_t local_238;
  backtrace_full_callback local_230;
  backtrace_state *local_228;
  dwarf_data *local_220;
  int lineno;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  syminfo p_Stack_1f0;
  undefined1 local_1e8 [16];
  backtrace_freelist_struct *local_1d8 [2];
  function_vector lvec;
  undefined1 local_180 [16];
  backtrace_state *local_170;
  fileline p_Stack_168;
  int local_160;
  syminfo p_Stack_158;
  backtrace_state *local_150;
  int iStack_148;
  backtrace_freelist_struct *local_140;
  dwarf_data *local_138;
  backtrace_state *local_130;
  line **local_128;
  unit *local_120;
  undefined1 local_118 [24];
  backtrace_state *pbStack_100;
  char *filename;
  uchar *local_f0;
  char **local_e8;
  size_t local_e0;
  int local_d8;
  backtrace_error_callback local_d0;
  void *local_c8;
  int local_c0;
  
  *found = 1;
  pc_local = pc;
  if (pc == 0xffffffffffffffff || ddata->addrs_count == 0) {
    pvVar29 = (void *)0x0;
  }
  else {
    pvVar29 = bsearch(&pc_local,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search);
  }
  if (pvVar29 != (void *)0x0) {
    puVar19 = (unit_addrs *)((long)pvVar29 - 0x30);
    do {
      puVar20 = puVar19 + 1;
      puVar48 = puVar19 + 3;
      puVar19 = puVar20;
    } while (pc_local == puVar48->low);
    do {
      puVar19 = puVar20 + 1;
      if (pc_local < puVar20[1].high) {
        puVar47 = puVar20[1].u;
        pplVar39 = &puVar47->lines;
        __base = puVar47->lines;
        if ((puVar19 <= ddata->addrs) || (pc_local < puVar20->low)) goto LAB_00398917;
        ppuVar35 = &puVar20->u;
        puVar48 = puVar19;
        goto LAB_0039889a;
      }
    } while ((puVar19 != ddata->addrs) &&
            (puVar6 = &puVar20->low, puVar19 = puVar20 + 1, puVar20 = puVar20 + -1,
            puVar19->low <= *puVar6));
  }
  *found = 0;
  return 0;
  while( true ) {
    if (state->threaded != 0) {
      __base = *pplVar39;
    }
    puVar19 = puVar48;
    if (__base != (line *)0xffffffffffffffff) break;
    puVar48 = (unit_addrs *)(ppuVar35 + -2);
    puVar47 = *ppuVar35;
    pplVar39 = &puVar47->lines;
    __base = puVar47->lines;
    puVar19 = puVar21;
    if (puVar48 <= ddata->addrs) break;
    puVar1 = (ulong *)(ppuVar35 + -5);
    puVar20 = puVar21 + -1;
    ppuVar35 = ppuVar35 + -3;
    puVar19 = puVar48;
    puVar48 = puVar21;
    if (pc_local < *puVar1) break;
LAB_0039889a:
    puVar21 = puVar20;
    if (ppuVar35[-1] <= pc_local) {
      puVar19 = (unit_addrs *)(ppuVar35 + 1);
      break;
    }
  }
LAB_00398917:
  if (state->threaded != 0) {
    __base = *pplVar39;
  }
  cVar43 = '\x01';
  if (__base == (line *)0x0) {
    u = puVar19->u;
    local_118._0_16_ = (undefined1  [16])0x0;
    stack0xfffffffffffffef8 = (undefined1  [16])0x0;
    _lineno = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    _local_1f8 = (undefined1  [16])0x0;
    local_1e8 = (undefined1  [16])0x0;
    local_1d8[0] = (backtrace_freelist_struct *)0x0;
    uVar3 = u->lineoff;
    uVar4 = (ddata->dwarf_sections).size[1];
    p_Var22 = (fileline)(uVar4 - uVar3);
    local_230 = callback;
    local_220 = ddata;
    local_128 = pplVar39;
    local_120 = puVar47;
    if (uVar4 < uVar3 || p_Var22 == (fileline)0x0) {
      pbVar45 = (backtrace_state *)data;
      (*error_callback)(data,"unit line offset out of range",0);
      callback = callback;
LAB_0039967d:
      hdr = (line_header *)local_118;
      local_118._16_8_ = local_118._16_8_ + local_118._8_8_;
      local_118._8_8_ = 0;
      pvVar29 = data;
      backtrace_vector_release(pbVar45,(backtrace_vector *)hdr,error_callback,data);
      free_line_header((backtrace_state *)&lineno,hdr,error_callback_01,pvVar29);
      hdr_00 = (dwarf_data *)CONCAT71((int7)((ulong)hdr >> 8),1);
      __base = (line *)0xffffffffffffffff;
      pbVar45 = (backtrace_state *)0x0;
    }
    else {
      local_180._0_8_ = ".debug_line";
      local_180._8_8_ = (ddata->dwarf_sections).data[1];
      local_170 = (backtrace_state *)(local_180._8_8_ + uVar3);
      local_160 = ddata->is_bigendian;
      iStack_148 = 0;
      p_Stack_168 = p_Var22;
      p_Stack_158 = (syminfo)error_callback;
      local_150 = (backtrace_state *)data;
      uVar15 = read_uint32((dwarf_buf *)local_180);
      if (uVar15 == 0xffffffff) {
        p_Stack_168 = (fileline)read_uint64((dwarf_buf *)local_180);
      }
      else {
        p_Stack_168 = (fileline)(ulong)uVar15;
      }
      uVar14 = read_uint16((dwarf_buf *)local_180);
      pbVar45 = local_170;
      auVar9 = _lineno;
      lineno = CONCAT22(0,uVar14);
      if ((ushort)(uVar14 - 6) < 0xfffc) {
        pcVar37 = "unsupported line number version";
LAB_00399645:
        puVar46 = (uchar *)local_180._0_8_;
        snprintf((char *)&filename,200,"%s in %s at %d");
        pbVar45 = local_150;
        (*p_Stack_158)(local_150,(uintptr_t)&filename,(backtrace_syminfo_callback)0xffffffff,
                       (backtrace_error_callback)pcVar37,puVar46);
        callback = local_230;
        goto LAB_0039967d;
      }
      if (uVar14 == 5) {
        iVar16 = advance((dwarf_buf *)local_180,1);
        pbVar27 = local_170;
        if (iVar16 == 0) {
          uVar40 = 0;
        }
        else {
          uVar40 = (uint)*(byte *)&pbVar45->filename;
        }
        uStack_214 = uVar40;
        iVar16 = advance((dwarf_buf *)local_180,1);
        if ((iVar16 != 0) && (*(uchar *)&pbVar27->filename != '\0')) {
          pcVar37 = "non-zero segment_selector_size not supported";
          goto LAB_00399645;
        }
      }
      else {
        _uStack_210 = auVar9._8_8_;
        uStack_214 = u->addrsize;
      }
      if (uVar15 == 0xffffffff) {
        lvec.count = read_uint64((dwarf_buf *)local_180);
      }
      else {
        uVar15 = read_uint32((dwarf_buf *)local_180);
        lvec.count = (size_t)uVar15;
      }
      iVar16 = iStack_148;
      pbVar27 = local_150;
      error_callback_00 = p_Stack_158;
      pbVar45 = (backtrace_state *)local_180;
      lvec.vec.size = local_180._8_8_;
      lvec.vec.base = (void *)local_180._0_8_;
      lvec.vec.alc = (size_t)local_170;
      iVar17 = advance((dwarf_buf *)pbVar45,lvec.count);
      callback = local_230;
      if (iVar17 == 0) goto LAB_0039967d;
      sVar12 = lvec.vec.alc;
      iVar17 = advance((dwarf_buf *)&lvec,1);
      auVar9 = _lineno;
      if (iVar17 == 0) {
        uVar40 = 0;
      }
      else {
        uVar40 = (uint)*(byte *)sVar12;
      }
      uStack_210 = uVar40;
      auVar8 = _lineno;
      auVar10 = _lineno;
      uStack_20c = 1;
      lineno = auVar9._0_4_;
      bVar5 = 3 < lineno;
      _lineno = auVar8;
      if (bVar5) {
        sVar12 = lvec.vec.alc;
        _lineno = auVar10;
        iVar17 = advance((dwarf_buf *)&lvec,1);
        if (iVar17 == 0) {
          uStack_20c = 0;
        }
        else {
          uStack_20c = (uint)*(byte *)sVar12;
        }
      }
      advance((dwarf_buf *)&lvec,1);
      sVar12 = lvec.vec.alc;
      iVar17 = advance((dwarf_buf *)&lvec,1);
      uVar40 = 0;
      iVar34 = 0;
      if (iVar17 != 0) {
        iVar34 = (int)*(char *)sVar12;
      }
      local_208._0_4_ = iVar34;
      sVar12 = lvec.vec.alc;
      iVar17 = advance((dwarf_buf *)&lvec,1);
      if (iVar17 != 0) {
        uVar40 = (uint)*(byte *)sVar12;
      }
      local_208._4_4_ = uVar40;
      sVar12 = lvec.vec.alc;
      iVar17 = advance((dwarf_buf *)&lvec,1);
      if (iVar17 == 0) {
        uVar40 = 0;
      }
      else {
        uVar40 = (uint)*(byte *)sVar12;
      }
      local_208._8_4_ = uVar40;
      pbVar45 = (backtrace_state *)&lvec;
      local_1f8 = (undefined1  [8])lvec.vec.alc;
      iVar17 = advance((dwarf_buf *)pbVar45,(ulong)(uVar40 - 1));
      callback = local_230;
      if (iVar17 == 0) goto LAB_0039967d;
      if (lineno < 5) {
        p_Stack_1f0 = (syminfo)0x0;
        pcVar37 = (char *)lvec.vec.alc;
        if (0 < (long)lvec.count) {
          pbVar49 = (backtrace_state *)(lvec.count + lvec.vec.alc);
          pbVar28 = (backtrace_state *)lvec.vec.alc;
          do {
            p_Var42 = p_Stack_1f0 + 1;
            if (*(char *)&pbVar28->filename == '\0') break;
            pbVar45 = pbVar28;
            sVar23 = strnlen((char *)pbVar28,(long)pbVar49 - (long)pbVar28);
            pbVar28 = (backtrace_state *)((long)&pbVar28->filename + sVar23 + 1);
            p_Stack_1f0 = p_Var42;
          } while (pbVar28 < pbVar49);
        }
        p_Var42 = p_Stack_1f0;
        p_Stack_1f0 = p_Stack_1f0 + 1;
        puVar24 = (undefined8 *)
                  backtrace_alloc(pbVar45,(long)p_Var42 * 8 + 8,
                                  (backtrace_error_callback)error_callback_00,pbVar27);
        local_1e8._0_8_ = puVar24;
        callback = local_230;
        if (puVar24 != (undefined8 *)0x0) {
          *puVar24 = u->comp_dir;
          if (*pcVar37 != '\0') {
            lVar50 = 8;
            do {
              callback = local_230;
              if (iVar16 != 0) goto LAB_0039967d;
              sVar23 = strnlen(pcVar37,lvec.count);
              pbVar45 = (backtrace_state *)&lvec;
              iVar17 = advance((dwarf_buf *)&lvec,sVar23 + 1);
              if (iVar17 == 0) {
                pcVar37 = (char *)0x0;
              }
              *(char **)(local_1e8._0_8_ + lVar50) = pcVar37;
              callback = local_230;
              if (*(long *)(local_1e8._0_8_ + lVar50) == 0) goto LAB_0039967d;
              lVar50 = lVar50 + 8;
              pcVar37 = (char *)lvec.vec.alc;
            } while (*(char *)lvec.vec.alc != '\0');
          }
          pbVar45 = (backtrace_state *)&lvec;
          iVar17 = advance((dwarf_buf *)pbVar45,1);
          callback = local_230;
          if (iVar17 != 0) {
            local_1e8._8_8_ = 0;
            if (0 < (long)lvec.count) {
              pcVar53 = (char *)(lvec.count + lvec.vec.alc);
              pcVar37 = (char *)lvec.vec.alc;
              do {
                uVar11 = local_1e8._8_8_;
                if (*pcVar37 == '\0') break;
                sVar23 = strnlen(pcVar37,(long)pcVar53 - (long)pcVar37);
                lVar36 = 1;
                lVar50 = 1;
                if (pcVar37[sVar23 + 1] < '\0') {
                  lVar44 = 1;
                  do {
                    lVar50 = lVar44 + 1;
                    lVar7 = lVar44 + sVar23 + 1;
                    lVar44 = lVar50;
                  } while (pcVar37[lVar7] < '\0');
                }
                if (pcVar37[lVar50 + sVar23 + 1] < '\0') {
                  lVar44 = 1;
                  do {
                    lVar36 = lVar44 + 1;
                    lVar7 = lVar44 + sVar23 + lVar50 + 1;
                    lVar44 = lVar36;
                  } while (pcVar37[lVar7] < '\0');
                }
                lVar44 = lVar50 + sVar23 + 1;
                pbVar45 = (backtrace_state *)0x1;
                if (pcVar37[lVar36 + lVar44] < '\0') {
                  pbVar28 = (backtrace_state *)0x1;
                  do {
                    pbVar45 = (backtrace_state *)((long)&pbVar28->filename + 1);
                    pcVar2 = pcVar37 + sVar23 + lVar50 + lVar36 + 1 + (long)pbVar28;
                    pbVar28 = pbVar45;
                  } while (*pcVar2 < '\0');
                }
                pcVar37 = pcVar37 + lVar36 + lVar44 + (long)pbVar45;
                local_1e8._8_8_ = uVar11 + 1;
              } while (pcVar37 < pcVar53);
            }
            uVar11 = local_1e8._8_8_;
            local_1e8._8_8_ = local_1e8._8_8_ + 1;
            local_1d8[0] = (backtrace_freelist_struct *)
                           backtrace_alloc(pbVar45,uVar11 * 8 + 8,
                                           (backtrace_error_callback)error_callback_00,pbVar27);
            callback = local_230;
            if (local_1d8[0] != (backtrace_freelist_struct *)0x0) {
              *(char **)local_1d8[0] = u->filename;
              lVar50 = 1;
              do {
                sVar12 = lvec.vec.alc;
                if (*(char *)lvec.vec.alc == '\0') goto LAB_0039906e;
                if (iVar16 == 0) {
                  sVar23 = strnlen((char *)lvec.vec.alc,lvec.count);
                  pbVar45 = (backtrace_state *)&lvec;
                  iVar17 = advance((dwarf_buf *)&lvec,sVar23 + 1);
                  bVar5 = false;
                  if (iVar17 != 0) {
                    p_Var42 = (syminfo)read_uleb128((dwarf_buf *)&lvec);
                    pvVar29 = (void *)sVar12;
                    if (*(char *)sVar12 != '/') {
                      if (p_Stack_1f0 <= p_Var42) {
                        bVar5 = false;
                        pcVar37 = "invalid directory index in line number program header";
                        pvVar29 = lvec.vec.base;
                        snprintf((char *)&filename,200,"%s in %s at %d");
                        pbVar45 = pbVar27;
                        (*error_callback_00)
                                  (pbVar27,(uintptr_t)&filename,(backtrace_syminfo_callback)0x0,
                                   (backtrace_error_callback)pcVar37,pvVar29);
                        goto LAB_00398fd4;
                      }
                      pcVar37 = *(char **)(local_1e8._0_8_ + p_Var42 * 8);
                      if (pcVar37 != (char *)0x0) {
                        sVar23 = strlen(pcVar37);
                        pbVar45 = (backtrace_state *)sVar12;
                        sVar31 = strlen((char *)sVar12);
                        pvVar29 = backtrace_alloc(pbVar45,sVar31 + sVar23 + 2,
                                                  (backtrace_error_callback)error_callback_00,
                                                  pbVar27);
                        if (pvVar29 == (void *)0x0) {
                          bVar5 = false;
                          goto LAB_00398fd4;
                        }
                        memcpy(pvVar29,pcVar37,sVar23);
                        *(undefined1 *)((long)pvVar29 + sVar23) = 0x2f;
                        memcpy((void *)((long)pvVar29 + sVar23 + 1),(void *)sVar12,sVar31 + 1);
                      }
                    }
                    pbVar45 = (backtrace_state *)&lvec;
                    *(void **)(local_1d8[0] + lVar50 * 8) = pvVar29;
                    read_uleb128((dwarf_buf *)pbVar45);
                    read_uleb128((dwarf_buf *)pbVar45);
                    lVar50 = lVar50 + 1;
                    bVar5 = true;
                  }
                }
                else {
                  bVar5 = false;
                }
LAB_00398fd4:
                callback = local_230;
              } while (bVar5);
            }
          }
        }
        goto LAB_0039967d;
      }
      pbVar45 = state;
      iVar17 = read_line_header_format_entries
                         (state,local_220,u,(dwarf_buf *)&lvec,(line_header *)&lineno,
                          (size_t *)(local_1f8 + 8),(char ***)local_1e8);
      callback = local_230;
      if ((iVar17 == 0) ||
         (pbVar45 = state,
         iVar17 = read_line_header_format_entries
                            (state,local_220,u,(dwarf_buf *)&lvec,(line_header *)&lineno,
                             (size_t *)(local_1e8 + 8),(char ***)local_1d8), callback = local_230,
         iVar17 == 0)) goto LAB_0039967d;
LAB_0039906e:
      callback = local_230;
      if (iVar16 != 0) goto LAB_0039967d;
      if ((ulong)local_1e8._8_8_ < 2) {
        local_228 = (backtrace_state *)0x736f2f;
      }
      else {
        local_228 = *(backtrace_state **)(local_1d8[0] + 8);
      }
      uVar40 = 1;
      pbVar45 = (backtrace_state *)local_180;
      local_268 = (dwarf_data *)0x0;
      pc_00 = 0;
      local_130 = local_228;
      do {
        p_Var22 = p_Stack_168;
        pbVar27 = local_170;
        if (p_Stack_168 == (fileline)0x0) break;
        iVar16 = advance((dwarf_buf *)pbVar45,1);
        if (iVar16 == 0) {
          uVar18 = 0;
        }
        else {
          uVar18 = (uint)*(byte *)&pbVar27->filename;
        }
        if ((uint)local_208._8_4_ <= uVar18) {
          uVar41 = (uVar18 - local_208._8_4_) / (uint)local_208._4_4_ + (int)local_268;
          local_268 = (dwarf_data *)((ulong)uVar41 % (ulong)uStack_20c);
          pc_00 = pc_00 + (ulong)(uStack_210 * uVar41) / (ulong)uStack_20c;
          uVar40 = uVar40 + local_208._0_4_ + (uVar18 - local_208._8_4_) % (uint)local_208._4_4_;
LAB_00399175:
          add_line(state,local_220,pc_00,(char *)local_228,uVar40,
                   (backtrace_error_callback)p_Stack_158,local_150,(line_vector *)local_118);
          goto switchD_00399127_caseD_6;
        }
        switch((ulong)uVar18) {
        case 0:
          local_238 = read_uleb128((dwarf_buf *)pbVar45);
          pbVar27 = local_170;
          iVar16 = advance((dwarf_buf *)pbVar45,1);
          pbVar28 = local_170;
          if (iVar16 == 0) {
            uVar18 = 0;
          }
          else {
            uVar18 = (uint)*(byte *)&pbVar27->filename;
          }
          switch(uVar18) {
          case 1:
            local_228 = local_130;
            pc_00 = 0;
            local_268 = (dwarf_data *)0;
            uVar40 = uVar18;
            break;
          case 2:
            pc_00 = read_address((dwarf_buf *)pbVar45,uStack_214);
            break;
          case 3:
            sVar23 = strnlen((char *)local_170,(size_t)p_Stack_168);
            iVar16 = advance((dwarf_buf *)pbVar45,sVar23 + 1);
            bVar5 = false;
            pbVar27 = (backtrace_state *)0x0;
            if (iVar16 != 0) {
              pbVar27 = pbVar28;
            }
            pbVar28 = local_228;
            if (pbVar27 != (backtrace_state *)0x0) {
              local_238 = read_uleb128((dwarf_buf *)pbVar45);
              read_uleb128((dwarf_buf *)pbVar45);
              read_uleb128((dwarf_buf *)pbVar45);
              bVar5 = true;
              pbVar28 = pbVar27;
              if (*(uchar *)&pbVar27->filename != '/') {
                if ((syminfo)(local_238 & 0xffffffff) < p_Stack_1f0) {
                  local_140 = *(backtrace_freelist_struct **)
                               (local_1e8._0_8_ + (syminfo)(local_238 & 0xffffffff) * 8);
                  local_238 = strlen((char *)local_140);
                  local_138 = (dwarf_data *)strlen((char *)pbVar27);
                  pbVar28 = (backtrace_state *)
                            backtrace_alloc(pbVar28,(long)(local_138->dwarf_sections).data +
                                                    (local_238 - 0x36),
                                            (backtrace_error_callback)p_Stack_158,local_150);
                  if (pbVar28 != (backtrace_state *)0x0) {
                    memcpy(pbVar28,local_140,local_238);
                    *(uchar *)((long)&pbVar28->filename + local_238) = '/';
                    memcpy((uchar *)((long)&pbVar28->filename + local_238 + 1),pbVar27,
                           (size_t)((long)&((backtrace_vector *)&local_138->next)->base + 1));
                    bVar5 = true;
                    goto LAB_00399507;
                  }
                }
                else {
                  dwarf_buf_error((dwarf_buf *)pbVar45,
                                  "invalid directory index in line number program",0);
                }
                bVar5 = false;
                pbVar28 = local_228;
              }
            }
LAB_00399507:
            local_228 = pbVar28;
            if (bVar5) break;
            bVar5 = false;
            goto LAB_0039951e;
          case 4:
            read_uleb128((dwarf_buf *)pbVar45);
            break;
          default:
            iVar16 = advance((dwarf_buf *)pbVar45,local_238 - 1);
            if (iVar16 == 0) {
              bVar5 = false;
              goto LAB_0039951e;
            }
          }
          bVar5 = true;
LAB_0039951e:
          if (bVar5) break;
          goto LAB_00399526;
        case 1:
          goto LAB_00399175;
        case 2:
          uVar26 = read_uleb128((dwarf_buf *)pbVar45);
          pc_00 = pc_00 + ((ulong)uStack_210 * (uVar26 + (long)local_268)) / (ulong)uStack_20c;
          local_268 = (dwarf_data *)((uVar26 + (long)local_268) % (ulong)uStack_20c);
          break;
        case 3:
          iVar25 = read_sleb128((dwarf_buf *)pbVar45);
          uVar40 = uVar40 + (int)iVar25;
          break;
        case 4:
          uVar26 = read_uleb128((dwarf_buf *)pbVar45);
          if (uVar26 < (ulong)local_1e8._8_8_) {
            local_228 = *(backtrace_state **)(local_1d8[0] + uVar26 * 8);
            break;
          }
          pcVar37 = "invalid file number in line number program";
          puVar46 = (uchar *)local_180._0_8_;
          snprintf((char *)&filename,200,"%s in %s at %d");
          (*p_Stack_158)(local_150,(uintptr_t)&filename,(backtrace_syminfo_callback)0x0,
                         (backtrace_error_callback)pcVar37,puVar46);
LAB_00399526:
          bVar5 = false;
          goto LAB_003991a3;
        case 5:
        case 0xc:
          read_uleb128((dwarf_buf *)pbVar45);
        case 6:
        case 7:
        case 10:
        case 0xb:
switchD_00399127_caseD_6:
          break;
        case 8:
          uVar18 = (0xff - local_208._8_4_) / (uint)local_208._4_4_ + (int)local_268;
          pc_00 = pc_00 + (ulong)(uStack_210 * uVar18) / (ulong)uStack_20c;
          local_268 = (dwarf_data *)((ulong)uVar18 % (ulong)uStack_20c);
          goto switchD_00399127_caseD_6;
        case 9:
          uVar14 = read_uint16((dwarf_buf *)pbVar45);
          pc_00 = pc_00 + uVar14;
          local_268 = (dwarf_data *)0x0;
          break;
        default:
          uVar41 = (uint)*(byte *)((long)local_1f8 + ((ulong)uVar18 - 1));
          if (*(byte *)((long)local_1f8 + ((ulong)uVar18 - 1)) == 0) goto switchD_00399127_caseD_6;
          do {
            read_uleb128((dwarf_buf *)pbVar45);
            uVar41 = uVar41 - 1;
          } while (uVar41 != 0);
        }
        bVar5 = true;
LAB_003991a3:
      } while (bVar5);
      callback = local_230;
      if ((((p_Var22 != (fileline)0x0) || (iStack_148 != 0)) ||
          (pbStack_100 == (backtrace_state *)0x0)) ||
         (puVar24 = (undefined8 *)
                    backtrace_vector_grow
                              (pbVar45,0x18,error_callback,data,(backtrace_vector *)local_118),
         puVar24 == (undefined8 *)0x0)) goto LAB_0039967d;
      *puVar24 = 0xffffffffffffffff;
      *(undefined1 (*) [16])(puVar24 + 1) = (undefined1  [16])0x0;
      iVar16 = backtrace_vector_release(pbVar45,(backtrace_vector *)local_118,error_callback,data);
      if (iVar16 == 0) goto LAB_0039967d;
      __base = (line *)local_118._0_8_;
      pbVar45 = pbStack_100;
      backtrace_qsort((void *)local_118._0_8_,(size_t)pbStack_100,0x18,line_compare);
      hdr_00 = (dwarf_data *)0x0;
    }
    pfVar54 = (function_addrs *)0x0;
    local_268 = (dwarf_data *)0x0;
    if ((char)hdr_00 == '\0') {
      local_228 = (backtrace_state *)CONCAT44(local_228._4_4_,(int)hdr_00);
      iVar16 = state->threaded;
      local_138 = (dwarf_data *)0x0;
      if (iVar16 == 0) {
        local_138 = (dwarf_data *)&local_220->fvec;
      }
      local_140 = (backtrace_freelist_struct *)&local_138->addrs;
      puVar47 = puVar19->u;
      local_238 = CONCAT44(local_238._4_4_,iVar16);
      ppuVar32 = (unit_addrs **)local_140;
      vec_function = local_138;
      if (iVar16 != 0) {
        ppuVar32 = (unit_addrs **)&lvec.count;
        lvec.vec.alc = 0;
        lvec.count = 0;
        lvec.vec.base = (void *)0x0;
        lvec.vec.size = 0;
        vec_function = (dwarf_data *)&lvec;
      }
      filename = ".debug_info";
      local_f0 = (local_220->dwarf_sections).data[0];
      local_e8 = (char **)puVar47->unit_data;
      local_e0 = puVar47->unit_data_len;
      local_d8 = local_220->is_bigendian;
      local_c0 = 0;
      local_268 = (dwarf_data *)0x0;
      data_00 = (code *)local_220;
      pplVar39 = local_128;
      local_130 = pbVar45;
      local_d0 = error_callback;
      local_c8 = data;
      do {
        callback = local_230;
        if (local_e0 == 0) {
          local_268 = (dwarf_data *)0x0;
          pfVar54 = (function_addrs *)0x0;
          if (*ppuVar32 == (unit_addrs *)0x0) goto LAB_00399bb8;
          hdr_00 = (dwarf_data *)0x18;
          puVar33 = (undefined4 *)
                    backtrace_vector_grow
                              (pbVar45,0x18,error_callback,data,(backtrace_vector *)vec_function);
          pdVar13 = local_138;
          data_00 = (code *)0x0;
          local_268 = (dwarf_data *)0x0;
          pplVar39 = extraout_RDX_00;
          pfVar54 = (function_addrs *)0x0;
          if (puVar33 == (undefined4 *)0x0) goto LAB_00399bb8;
          *puVar33 = 0xffffffff;
          puVar33[1] = 0xffffffff;
          puVar33[2] = 0xffffffff;
          puVar33[3] = 0xffffffff;
          *(undefined8 *)(puVar33 + 4) = 0;
          count = (dwarf_data *)*ppuVar32;
          if ((int)local_238 == 0) {
            data_00 = (code *)data;
            hdr_00 = local_138;
            iVar16 = backtrace_vector_release
                               (pbVar45,(backtrace_vector *)local_138,error_callback,data);
            if (iVar16 == 0) {
              pfVar52 = (function_addrs *)0x0;
            }
            else {
              pfVar52 = (function_addrs *)((backtrace_vector *)&pdVar13->next)->base;
              pdVar13->next = (dwarf_data *)0x0;
              pdVar13->altlink = (dwarf_data *)0x0;
              pdVar13->base_address = 0;
            }
            local_268 = (dwarf_data *)0x0;
            pplVar39 = extraout_RDX_01;
            pfVar54 = (function_addrs *)0x0;
            if (pfVar52 == (function_addrs *)0x0) goto LAB_00399bb8;
            *(unit_addrs **)local_140 = (unit_addrs *)0x0;
          }
          else {
            hdr_00 = (dwarf_data *)&lvec;
            iVar16 = backtrace_vector_release
                               (pbVar45,(backtrace_vector *)hdr_00,error_callback,data);
            pfVar54 = (function_addrs *)0x0;
            data_00 = (code *)0x0;
            local_268 = (dwarf_data *)0x0;
            pplVar39 = extraout_RDX_02;
            if (iVar16 == 0) goto LAB_00399bb8;
            pfVar52 = (function_addrs *)((backtrace_vector *)&vec_function->next)->base;
          }
          data_00 = function_addrs_compare;
          hdr_00 = count;
          backtrace_qsort(pfVar52,(size_t)count,0x18,function_addrs_compare);
          pplVar39 = extraout_RDX_03;
          pfVar54 = pfVar52;
          local_268 = count;
          goto LAB_00399bb8;
        }
        data_00 = (code *)0x0;
        hdr_00 = local_220;
        pbVar45 = state;
        iVar16 = read_function_entry(state,local_220,puVar47,0,(dwarf_buf *)&filename,
                                     (line_header *)&lineno,error_callback,data,
                                     (function_vector *)vec_function,(function_vector *)vec_function
                                    );
        pplVar39 = extraout_RDX;
      } while (iVar16 != 0);
      callback = local_230;
      pfVar54 = (function_addrs *)0x0;
LAB_00399bb8:
      free_line_header((backtrace_state *)&lineno,(line_header *)hdr_00,
                       (backtrace_error_callback)pplVar39,data_00);
      hdr_00 = (dwarf_data *)((ulong)local_228 & 0xffffffff);
      pbVar45 = local_130;
    }
    cVar43 = (char)hdr_00;
    local_120->lines_count = (size_t)pbVar45;
    local_120->function_addrs = pfVar54;
    local_120->function_addrs_count = (size_t)local_268;
    *local_128 = __base;
    ddata = local_220;
  }
  if (__base == (line *)0xffffffffffffffff) {
    if (cVar43 == '\0') {
      iVar16 = dwarf_lookup_pc(state,ddata,pc_local,callback,error_callback,data,found);
      return iVar16;
    }
    pcVar37 = (char *)0x0;
LAB_00399b26:
    iVar16 = 0;
  }
  else {
    pvVar29 = bsearch(&pc_local,__base,puVar19->u->lines_count,0x18,line_search);
    puVar47 = puVar19->u;
    if (pvVar29 == (void *)0x0) {
      if (puVar47->abs_filename == (char *)0x0) {
        pcVar37 = puVar47->filename;
        if (pcVar37 == (char *)0x0) {
          pcVar53 = (char *)0x0;
        }
        else {
          pcVar53 = pcVar37;
          if ((*pcVar37 != '/') &&
             (pbVar45 = (backtrace_state *)puVar47->comp_dir, pbVar45 != (backtrace_state *)0x0)) {
            local_230 = callback;
            sVar23 = strlen(pcVar37);
            pbVar27 = pbVar45;
            sVar31 = strlen((char *)pbVar45);
            pcVar53 = (char *)backtrace_alloc(pbVar27,sVar23 + sVar31 + 2,error_callback,data);
            if (pcVar53 == (char *)0x0) {
              *found = 0;
              return 0;
            }
            memcpy(pcVar53,pbVar45,sVar31);
            pcVar53[sVar31] = '/';
            memcpy(pcVar53 + sVar31 + 1,pcVar37,sVar23 + 1);
            callback = local_230;
          }
        }
        puVar19->u->abs_filename = pcVar53;
      }
      pcVar37 = puVar19->u->abs_filename;
      goto LAB_00399b26;
    }
    if (puVar47->function_addrs_count == 0) {
      pcVar37 = *(char **)((long)pvVar29 + 8);
      iVar16 = *(int *)((long)pvVar29 + 0x10);
    }
    else {
      pvVar30 = bsearch(&pc_local,puVar47->function_addrs,puVar47->function_addrs_count,0x18,
                        function_addrs_search);
      if (pvVar30 != (void *)0x0) {
        pfVar54 = (function_addrs *)((long)pvVar30 + -0x18);
        do {
          pfVar51 = pfVar54 + 1;
          pfVar52 = pfVar54 + 2;
          pfVar54 = pfVar51;
        } while (pc_local == pfVar52->low);
        do {
          if (pc_local < pfVar51->high) goto LAB_003998d5;
        } while ((pfVar51 != puVar19->u->function_addrs) &&
                (pfVar54 = pfVar51 + -1, puVar6 = &pfVar51->low, pfVar51 = pfVar51 + -1,
                *puVar6 <= pfVar54->low));
        pfVar51 = (function_addrs *)0x0;
LAB_003998d5:
        if (pfVar51 != (function_addrs *)0x0) {
          function = pfVar51->function;
          filename = *(char **)((long)pvVar29 + 8);
          lineno = *(undefined4 *)((long)pvVar29 + 0x10);
          iVar16 = report_inlined_functions(pc_local,function,callback,data,&filename,&lineno);
          if (iVar16 != 0) {
            return iVar16;
          }
          uVar38 = pfVar51->low;
          pcVar53 = function->name;
          pcVar37 = filename;
          iVar16 = lineno;
          goto LAB_00399b2c;
        }
      }
      pcVar37 = *(char **)((long)pvVar29 + 8);
      iVar16 = *(int *)((long)pvVar29 + 0x10);
    }
  }
  uVar38 = 0;
  pcVar53 = (char *)0x0;
LAB_00399b2c:
  iVar16 = (*callback)(data,pc_local,uVar38,pcVar37,iVar16,pcVar53);
  return iVar16;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : (struct unit_addrs*)bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, 0, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, 0, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, fmatch->low, filename, lineno, function->name);
}